

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O3

Type * __thiscall
JsUtil::List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
AllocArray(List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
           *this,int size)

{
  Type *pTVar1;
  Type *pTVar2;
  size_t byteSize;
  
  if (size != 0) {
    byteSize = 0xffffffffffffffff;
    if (-1 < size) {
      byteSize = (long)size * 8;
    }
    pTVar1 = (Type *)new__<Memory::ArenaAllocator>
                               (byteSize,(this->
                                         super_ReadOnlyList<Wasm::EmitInfo,_Memory::ArenaAllocator,_DefaultComparer>
                                         ).alloc,0x364470);
    pTVar2 = pTVar1;
    do {
      pTVar2->super_EmitInfoBase = 0xffffffff;
      pTVar2->type = Void;
      pTVar2 = pTVar2 + 1;
    } while (pTVar2 != pTVar1 + size);
    return pTVar1;
  }
  return (Type *)&DAT_00000008;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}